

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_set_val(Tree *this,size_t node,csubstr val,type_bits more_flags)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  NodeData *pNVar4;
  
  sVar3 = num_children(this,node);
  if (sVar3 != 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_002867d8)
              ("check failed: num_children(node) == 0",0x25,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar4 = _p(this,node);
  if (((pNVar4->m_type).type & SEQ) == NOTYPE) {
    pNVar4 = _p(this,node);
    if (((pNVar4->m_type).type & MAP) == NOTYPE) goto LAB_0021d2dc;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  to_csubstr(
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            );
  (*(code *)PTR_error_impl_002867d8)
            ("check failed: !is_seq(node) && !is_map(node)",0x2c,
             (anonymous_namespace)::s_default_callbacks);
LAB_0021d2dc:
  pNVar4 = _p(this,node);
  (pNVar4->m_val).scalar.str = val.str;
  (pNVar4->m_val).scalar.len = val.len;
  _add_flags(this,node,more_flags | 1);
  return;
}

Assistant:

void _set_val(size_t node, csubstr val, type_bits more_flags=0)
    {
        RYML_ASSERT(num_children(node) == 0);
        RYML_ASSERT(!is_seq(node) && !is_map(node));
        _p(node)->m_val.scalar = val;
        _add_flags(node, VAL|more_flags);
    }